

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Blackboard.h
# Opt level: O2

size_t __thiscall cali::Blackboard::find_existing_entry(Blackboard *this,cali_id_t key)

{
  cali_id_t cVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = key;
  do {
    uVar3 = uVar2 % 0x3fd;
    cVar1 = *(cali_id_t *)((long)&this->hashtable[0].key + (ulong)(uint)((int)uVar3 << 5));
    if (cVar1 == key) {
      return uVar3;
    }
    uVar2 = uVar3 + 1;
  } while (cVar1 != 0xffffffffffffffff);
  return uVar3;
}

Assistant:

inline size_t find_existing_entry(cali_id_t key) const
    {
        size_t I = key % Nmax;

        while (hashtable[I].key != key && hashtable[I].key != CALI_INV_ID)
            I = (I + 1) % Nmax;

        return I;
    }